

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

linked_ptr<const_testing::CardinalityInterface> * __thiscall
testing::internal::linked_ptr<const_testing::CardinalityInterface>::operator=
          (linked_ptr<const_testing::CardinalityInterface> *this,
          linked_ptr<const_testing::CardinalityInterface> *ptr)

{
  linked_ptr_internal *this_00;
  CardinalityInterface *pCVar1;
  bool bVar2;
  
  if (ptr != this) {
    this_00 = &this->link_;
    bVar2 = linked_ptr_internal::depart(this_00);
    if ((bVar2) && (this->value_ != (CardinalityInterface *)0x0)) {
      (*this->value_->_vptr_CardinalityInterface[1])();
    }
    pCVar1 = ptr->value_;
    this->value_ = pCVar1;
    if (pCVar1 == (CardinalityInterface *)0x0) {
      this_00->next_ = this_00;
    }
    else {
      linked_ptr_internal::join(this_00,&ptr->link_);
    }
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }